

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

bool CLI::detail::process_quoted_string(string *str,char string_char,char literal_char)

{
  char key;
  char *pcVar1;
  bool bVar2;
  long lVar3;
  string sStack_38;
  
  if (str->_M_string_length < 2) {
    return false;
  }
  bVar2 = is_binary_escaped_string(str);
  if (bVar2) {
    extract_binary_string(&sStack_38,str);
  }
  else {
    pcVar1 = (str->_M_dataplus)._M_p;
    key = *pcVar1;
    if ((key != string_char) || (pcVar1[str->_M_string_length - 1] != string_char)) {
      if ((key != literal_char && key != '`') || (pcVar1[str->_M_string_length - 1] != key)) {
        return false;
      }
      remove_outer(str,key);
      goto LAB_0010dd23;
    }
    remove_outer(str,string_char);
    lVar3 = ::std::__cxx11::string::find((char)str,0x5c);
    if (lVar3 == -1) goto LAB_0010dd23;
    remove_escaped_characters(&sStack_38,str);
  }
  ::std::__cxx11::string::operator=((string *)str,(string *)&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
LAB_0010dd23:
  handle_secondary_array(str);
  return true;
}

Assistant:

CLI11_INLINE bool process_quoted_string(std::string &str, char string_char, char literal_char) {
    if(str.size() <= 1) {
        return false;
    }
    if(detail::is_binary_escaped_string(str)) {
        str = detail::extract_binary_string(str);
        handle_secondary_array(str);
        return true;
    }
    if(str.front() == string_char && str.back() == string_char) {
        detail::remove_outer(str, string_char);
        if(str.find_first_of('\\') != std::string::npos) {
            str = detail::remove_escaped_characters(str);
        }
        handle_secondary_array(str);
        return true;
    }
    if((str.front() == literal_char || str.front() == '`') && str.back() == str.front()) {
        detail::remove_outer(str, str.front());
        handle_secondary_array(str);
        return true;
    }
    return false;
}